

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_database.cpp
# Opt level: O0

bool __thiscall fineftp::UserDatabase::isUsernameAnonymousUser(UserDatabase *this,string *username)

{
  byte bVar1;
  bool bVar2;
  bool local_19;
  string *username_local;
  UserDatabase *this_local;
  
  bVar1 = ::std::__cxx11::string::empty();
  local_19 = true;
  if ((bVar1 & 1) == 0) {
    bVar2 = ::std::operator==(username,"ftp");
    local_19 = true;
    if (!bVar2) {
      local_19 = ::std::operator==(username,"anonymous");
    }
  }
  return local_19;
}

Assistant:

bool UserDatabase::isUsernameAnonymousUser(const std::string& username) const
  {
    return (username.empty()
      || username == "ftp"
      || username == "anonymous");
  }